

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool Curl_ssl_config_matches(ssl_primary_config *data,ssl_primary_config *needle)

{
  _Bool _Var1;
  int iVar2;
  
  if (((((data->version == needle->version) && (data->version_max == needle->version_max)) &&
       (data->ssl_options == needle->ssl_options)) &&
      (((((needle->field_0x71 ^ data->field_0x71) & 7) == 0 &&
        (_Var1 = blobcmp(data->cert_blob,needle->cert_blob), _Var1)) &&
       ((_Var1 = blobcmp(data->ca_info_blob,needle->ca_info_blob), _Var1 &&
        ((_Var1 = blobcmp(data->issuercert_blob,needle->issuercert_blob), _Var1 &&
         (_Var1 = Curl_safecmp(data->CApath,needle->CApath), _Var1)))))))) &&
     ((_Var1 = Curl_safecmp(data->CAfile,needle->CAfile), _Var1 &&
      (((((_Var1 = Curl_safecmp(data->issuercert,needle->issuercert), _Var1 &&
          (_Var1 = Curl_safecmp(data->clientcert,needle->clientcert), _Var1)) &&
         (iVar2 = Curl_safe_strcasecompare(data->cipher_list,needle->cipher_list), iVar2 != 0)) &&
        ((iVar2 = Curl_safe_strcasecompare(data->cipher_list13,needle->cipher_list13), iVar2 != 0 &&
         (iVar2 = Curl_safe_strcasecompare(data->curves,needle->curves), iVar2 != 0)))) &&
       ((iVar2 = Curl_safe_strcasecompare(data->CRLfile,needle->CRLfile), iVar2 != 0 &&
        (iVar2 = Curl_safe_strcasecompare(data->pinned_key,needle->pinned_key), iVar2 != 0)))))))) {
    return true;
  }
  return false;
}

Assistant:

bool
Curl_ssl_config_matches(struct ssl_primary_config *data,
                        struct ssl_primary_config *needle)
{
  if((data->version == needle->version) &&
     (data->version_max == needle->version_max) &&
     (data->ssl_options == needle->ssl_options) &&
     (data->verifypeer == needle->verifypeer) &&
     (data->verifyhost == needle->verifyhost) &&
     (data->verifystatus == needle->verifystatus) &&
     blobcmp(data->cert_blob, needle->cert_blob) &&
     blobcmp(data->ca_info_blob, needle->ca_info_blob) &&
     blobcmp(data->issuercert_blob, needle->issuercert_blob) &&
     Curl_safecmp(data->CApath, needle->CApath) &&
     Curl_safecmp(data->CAfile, needle->CAfile) &&
     Curl_safecmp(data->issuercert, needle->issuercert) &&
     Curl_safecmp(data->clientcert, needle->clientcert) &&
#ifdef USE_TLS_SRP
     !Curl_timestrcmp(data->username, needle->username) &&
     !Curl_timestrcmp(data->password, needle->password) &&
     (data->authtype == needle->authtype) &&
#endif
     Curl_safe_strcasecompare(data->cipher_list, needle->cipher_list) &&
     Curl_safe_strcasecompare(data->cipher_list13, needle->cipher_list13) &&
     Curl_safe_strcasecompare(data->curves, needle->curves) &&
     Curl_safe_strcasecompare(data->CRLfile, needle->CRLfile) &&
     Curl_safe_strcasecompare(data->pinned_key, needle->pinned_key))
    return TRUE;

  return FALSE;
}